

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_status_t flat_file_insert(ion_flat_file_t *flat_file,ion_key_t key,ion_value_t value)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  long lVar5;
  ion_status_t iVar6;
  ion_flat_file_row_t local_70;
  undefined1 local_58 [8];
  ion_flat_file_row_t row;
  ion_fpos_t last_record_loc;
  ion_fpos_t insert_loc;
  ion_err_t err;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_flat_file_t *flat_file_local;
  ion_status_t status;
  
  lVar5 = flat_file->eof_position;
  lVar1 = flat_file->start_of_data;
  uVar2 = flat_file->row_size;
  if ((flat_file->sorted_mode != '\0') &&
     (row.value = (ion_value_t)
                  ((ulong)(flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size
                  - 1), -1 < (long)row.value)) {
    bVar3 = flat_file_read_row(flat_file,(ion_fpos_t)row.value,(ion_flat_file_row_t *)local_58);
    if (bVar3 != 0) {
      flat_file_local = (ion_flat_file_t *)(ulong)bVar3;
      return (ion_status_t)flat_file_local;
    }
    cVar4 = (*(flat_file->super).compare)
                      (key,(ion_key_t)row._0_8_,(flat_file->super).record.key_size);
    if (cVar4 < '\0') {
      iVar6.error = '\x14';
      iVar6._1_3_ = 0;
      iVar6.count = 0;
      return iVar6;
    }
  }
  local_70.row_status = '\x01';
  local_70.key = key;
  local_70.value = value;
  bVar3 = flat_file_write_row(flat_file,(ulong)(lVar5 - lVar1) / uVar2,&local_70);
  if (bVar3 == 0) {
    lVar5 = ftell((FILE *)flat_file->data_file);
    flat_file->eof_position = lVar5;
    if (flat_file->eof_position == -1) {
      flat_file_local = (ion_flat_file_t *)0x8;
    }
    else {
      flat_file_local = (ion_flat_file_t *)0x100000000;
    }
  }
  else {
    flat_file_local = (ion_flat_file_t *)(ulong)bVar3;
  }
  return (ion_status_t)flat_file_local;
}

Assistant:

ion_status_t
flat_file_insert(
	ion_flat_file_t *flat_file,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_status_t	status	= ION_STATUS_INITIALIZE;
	ion_err_t		err;
	/* We can assume append-only insert here because our delete operation does a swap replacement, and
	   in sorted mode, we don't allow deletes - so there are no holes to fill. */
	ion_fpos_t insert_loc	= (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;

	if (flat_file->sorted_mode) {
		ion_fpos_t			last_record_loc = (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size - 1;
		ion_flat_file_row_t row;

		if (last_record_loc >= 0) {
			err = flat_file_read_row(flat_file, last_record_loc, &row);

			if (err_ok != err) {
				status.error = err;
				return status;
			}

			if (flat_file->super.compare(key, row.key, flat_file->super.record.key_size) < 0) {
				status.error = err_sorted_order_violation;
				return status;
			}
		}
	}

	err = flat_file_write_row(flat_file, insert_loc, &(ion_flat_file_row_t) { ION_FLAT_FILE_STATUS_OCCUPIED, key, value });

	if (err_ok != err) {
		status.error = err;
		return status;
	}

	/* Record new eof position */
	flat_file->eof_position = ftell(flat_file->data_file);

	if (-1 == flat_file->eof_position) {
		status.error = err_file_read_error;
		return status;
	}

	status.error	= err_ok;
	status.count	= 1;
	return status;
}